

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int TPZShapeHDivConstant<pzshape::TPZShapeTetra>::NHDivShapeF(TPZShapeData *data)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = 4;
  uVar2 = (uint)(data->fHDivNumConnectShape).super_TPZVec<int>.fNElements;
  if (6 < (int)uVar2) {
    iVar1 = 0;
    uVar3 = 6;
    do {
      iVar1 = iVar1 + (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    iVar1 = iVar1 + 4;
  }
  return iVar1;
}

Assistant:

inline int64_t size() const { return fNElements; }